

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

int __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateStaticVariableInitializers
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Descriptor *this_00;
  int iVar1;
  int iVar2;
  Nonnull<char_*> pcVar3;
  Descriptor *pDVar4;
  Descriptor **ppDVar5;
  char *pcVar6;
  Descriptor *in_RDX;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  size_t sVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  string_view text;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_e8;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  undefined1 local_a0 [16];
  undefined1 local_90 [72];
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_48;
  
  local_c8.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_c8.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_c8.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  UniqueFileScopeIdentifier_abi_cxx11_
            ((string *)local_a0,(java *)(this->super_MessageGenerator).descriptor_,in_RDX);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[11]>(&local_e8,&local_c8,(char (*) [11])0x560b8b);
  std::__cxx11::string::operator=
            ((string *)((long)local_e8.first.field_1.slot_ + 0x10),(string *)local_a0);
  if ((Descriptor *)local_a0._0_8_ != (Descriptor *)local_90) {
    operator_delete((void *)local_a0._0_8_,local_90._0_8_ + 1);
  }
  pDVar4 = (this->super_MessageGenerator).descriptor_;
  ppDVar5 = &pDVar4->file_->message_types_;
  if (pDVar4->containing_type_ != (Descriptor *)0x0) {
    ppDVar5 = &pDVar4->containing_type_->nested_types_;
  }
  pcVar3 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                     ((int)((ulong)((long)pDVar4 - (long)*ppDVar5) >> 5) * -0x33333333,
                      (Nonnull<char_*>)local_90);
  local_a0._0_8_ = pcVar3 + -(long)local_90;
  local_e8.first.ctrl_ = &local_e8.second;
  local_a0._8_8_ = (Descriptor *)local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,(Descriptor *)local_90,pcVar3)
  ;
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[6]>(&local_48,&local_c8,(char (*) [6])0x51e287);
  std::__cxx11::string::operator=
            ((string *)((long)local_48.first.field_1.slot_ + 0x10),(string *)&local_e8);
  if ((bool *)local_e8.first.ctrl_ != &local_e8.second) {
    operator_delete(local_e8.first.ctrl_,local_e8._16_8_ + 1);
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_a0,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true
            );
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[10]>(&local_e8,&local_c8,(char (*) [10])0x549f88);
  std::__cxx11::string::operator=
            ((string *)((long)local_e8.first.field_1.slot_ + 0x10),(string *)local_a0);
  pDVar4 = extraout_RDX;
  if ((Descriptor *)local_a0._0_8_ != (Descriptor *)local_90) {
    operator_delete((void *)local_a0._0_8_,local_90._0_8_ + 1);
    pDVar4 = extraout_RDX_00;
  }
  this_00 = ((this->super_MessageGenerator).descriptor_)->containing_type_;
  if (this_00 == (Descriptor *)0x0) {
    pcVar6 = 
    "internal_$identifier$_descriptor =\n  getDescriptor().getMessageTypes().get($index$);\n";
    sVar7 = 0x55;
  }
  else {
    UniqueFileScopeIdentifier_abi_cxx11_((string *)local_a0,(java *)this_00,pDVar4);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[7]>(&local_e8,&local_c8,(char (*) [7])"parent");
    std::__cxx11::string::operator=
              ((string *)((long)local_e8.first.field_1.slot_ + 0x10),(string *)local_a0);
    if ((Descriptor *)local_a0._0_8_ != (Descriptor *)local_90) {
      operator_delete((void *)local_a0._0_8_,local_90._0_8_ + 1);
    }
    bVar10 = ((this->super_MessageGenerator).descriptor_)->containing_type_ == (Descriptor *)0x0;
    sVar7 = 0x61;
    if (bVar10) {
      sVar7 = 0x55;
    }
    pcVar6 = 
    "internal_$identifier$_descriptor =\n  internal_$parent$_descriptor.getNestedTypes().get($index$);\n"
    ;
    if (bVar10) {
      pcVar6 = 
      "internal_$identifier$_descriptor =\n  getDescriptor().getMessageTypes().get($index$);\n";
    }
  }
  text._M_str = pcVar6;
  text._M_len = sVar7;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_c8,text);
  iVar1 = GenerateFieldAccessorTableInitializer(this,printer);
  iVar1 = iVar1 + 0x1e;
  pDVar4 = (this->super_MessageGenerator).descriptor_;
  if (0 < pDVar4->nested_type_count_) {
    lVar8 = 0;
    lVar9 = 0;
    do {
      ImmutableMessageGenerator
                ((ImmutableMessageGenerator *)local_a0,
                 (Descriptor *)(&pDVar4->nested_types_->super_SymbolBase + lVar8),this->context_);
      iVar2 = GenerateStaticVariableInitializers((ImmutableMessageGenerator *)local_a0,printer);
      iVar1 = iVar1 + iVar2;
      local_a0._0_8_ = &PTR__ImmutableMessageGenerator_008286d8;
      FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
      ~FieldGeneratorMap((FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>
                          *)(local_90 + 0x28));
      local_a0._0_8_ = &PTR__MessageGenerator_00828690;
      absl::lts_20250127::container_internal::
      btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
      ::~btree((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                *)local_90);
      lVar9 = lVar9 + 1;
      pDVar4 = (this->super_MessageGenerator).descriptor_;
      lVar8 = lVar8 + 0xa0;
    } while (lVar9 < pDVar4->nested_type_count_);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set(&local_c8);
  return iVar1;
}

Assistant:

int ImmutableMessageGenerator::GenerateStaticVariableInitializers(
    io::Printer* printer) {
  int bytecode_estimate = 0;
  absl::flat_hash_map<absl::string_view, std::string> vars;
  vars["identifier"] = UniqueFileScopeIdentifier(descriptor_);
  vars["index"] = absl::StrCat(descriptor_->index());
  vars["classname"] = name_resolver_->GetImmutableClassName(descriptor_);
  if (descriptor_->containing_type() != nullptr) {
    vars["parent"] = UniqueFileScopeIdentifier(descriptor_->containing_type());
  }

  // The descriptor for this type.
  if (descriptor_->containing_type() == nullptr) {
    printer->Print(vars,
                   "internal_$identifier$_descriptor =\n"
                   "  getDescriptor().getMessageTypes().get($index$);\n");
    bytecode_estimate += 30;
  } else {
    printer->Print(
        vars,
        "internal_$identifier$_descriptor =\n"
        "  internal_$parent$_descriptor.getNestedTypes().get($index$);\n");
    bytecode_estimate += 30;
  }

  // And the FieldAccessorTable.
  bytecode_estimate += GenerateFieldAccessorTableInitializer(printer);

  // Generate static member initializers for all nested types.
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // TODO:  Reuse MessageGenerator objects?
    bytecode_estimate +=
        ImmutableMessageGenerator(descriptor_->nested_type(i), context_)
            .GenerateStaticVariableInitializers(printer);
  }
  return bytecode_estimate;
}